

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileLockUnix.cxx
# Opt level: O0

cmFileLockResult __thiscall cmFileLock::Release(cmFileLock *this)

{
  int iVar1;
  ulong uVar2;
  int lockResult;
  cmFileLock *this_local;
  
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    iVar1 = LockFile(this,6,2);
    std::__cxx11::string::operator=((string *)&this->Filename,"");
    close(this->File);
    this->File = -1;
    if (iVar1 == 0) {
      this_local = (cmFileLock *)cmFileLockResult::MakeOk();
    }
    else {
      this_local = (cmFileLock *)cmFileLockResult::MakeSystem();
    }
  }
  else {
    this_local = (cmFileLock *)cmFileLockResult::MakeOk();
  }
  return (cmFileLockResult)this_local;
}

Assistant:

cmFileLockResult cmFileLock::Release()
{
  if (this->Filename.empty()) {
    return cmFileLockResult::MakeOk();
  }
  const int lockResult = this->LockFile(F_SETLK, F_UNLCK);

  this->Filename = "";

  ::close(this->File);
  this->File = -1;

  if (lockResult == 0) {
    return cmFileLockResult::MakeOk();
  }
  return cmFileLockResult::MakeSystem();
}